

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::status(torrent *this,torrent_status *st,status_flags_t flags)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> rhs;
  info_hash_t *piVar4;
  pointer ppVar5;
  session_settings *s;
  int64_t iVar6;
  _Head_base<0UL,_const_libtorrent::file_storage_*,_false> _Var7;
  int64_t iVar8;
  rep rVar9;
  ulong uVar10;
  element_type *this_00;
  pointer ppVar11;
  uint local_260;
  uint local_25c;
  bool local_245;
  uint local_244;
  uint local_240;
  int local_23c;
  int local_238;
  int local_234;
  tuple<int&,int&> local_228 [20];
  pair<int,_int> local_214;
  uint local_20c;
  uint local_208;
  uint local_204;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_200;
  int local_1fc;
  int local_1f8;
  piece_index_t local_1f4;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_1f0;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  local_1e4;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __end4;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __begin4
  ;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *__range4;
  int num_pieces;
  uint local_1c4;
  unsigned_long local_1c0;
  int local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  _Type local_1a2;
  announce_endpoint *local_1a0;
  __normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
  local_198;
  reference local_190;
  announce_entry *t;
  iterator __end3;
  iterator __begin3;
  tracker_list *__range3;
  undefined1 local_168 [6];
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  int local_144;
  duration<long,_std::ratio<1L,_1L>_> local_140;
  pointer local_138;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_130;
  __node_base local_128;
  int local_11c;
  duration<long,_std::ratio<1L,_1L>_> local_118;
  pointer local_110;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_108;
  uint local_fc;
  announce_entry *local_f8;
  pointer local_f0;
  duration<int,_std::ratio<1L,_1L>_> local_e4;
  undefined8 local_e0;
  duration<int,_std::ratio<1L,_1L>_> local_d4;
  bdecode_token *local_d0;
  duration<int,_std::ratio<1L,_1L>_> local_c4;
  char *local_c0;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  string local_a8;
  uint local_84;
  uint local_80;
  uint local_7c;
  string local_78;
  uint local_58;
  uint local_54;
  uint local_50;
  sha1_hash local_4c;
  undefined1 local_38 [20];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
  local_24;
  element_type *peStack_20;
  time_point32 now;
  torrent_status *st_local;
  torrent *this_local;
  status_flags_t flags_local;
  
  peStack_20 = (element_type *)st;
  local_24.__d.__r = (duration)time_now32();
  get_handle((torrent *)local_38);
  torrent_handle::operator=((torrent_handle *)peStack_20,(torrent_handle *)local_38);
  torrent_handle::~torrent_handle((torrent_handle *)local_38);
  piVar4 = info_hash(this);
  memcpy(&(peStack_20->m_comment).field_2,piVar4,0x34);
  piVar4 = info_hash(this);
  info_hash_t::get_best(&local_4c,piVar4);
  *(undefined8 *)
   (((sha1_hash *)((long)&(peStack_20->m_info_section).pn.pi_ + 4))->m_number)._M_elems =
       local_4c.m_number._M_elems._0_8_;
  *(undefined8 *)&(peStack_20->m_comment).field_0x4 = local_4c.m_number._M_elems._8_8_;
  *(uint *)((long)&(peStack_20->m_comment)._M_string_length + 4) = local_4c.m_number._M_elems[4];
  local_58 = 0x40;
  local_54 = flags.m_val;
  local_50 = (uint)libtorrent::flags::operator&
                             (flags.m_val,
                              (bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void>)0x40)
  ;
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_50);
  if (bVar1) {
    name_abi_cxx11_(&local_78,this);
    ::std::__cxx11::string::operator=
              ((string *)
               &(peStack_20->m_files).m_symlinks.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,(string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
  }
  local_84 = 0x80;
  local_80 = flags.m_val;
  local_7c = (uint)libtorrent::flags::operator&
                             (flags.m_val,
                              (bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void>)0x80)
  ;
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_7c);
  if (bVar1) {
    save_path_abi_cxx11_(&local_a8,this);
    ::std::__cxx11::string::operator=
              ((string *)&(peStack_20->m_files).m_file_hashes,(string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_a8);
  }
  local_b4 = 0x20;
  local_b0 = flags.m_val;
  local_ac = (uint)libtorrent::flags::operator&
                             (flags.m_val,
                              (bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void>)0x20)
  ;
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_ac);
  if (bVar1) {
    ::std::weak_ptr<libtorrent::torrent_info_const>::operator=
              ((weak_ptr<libtorrent::torrent_info_const> *)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                 *)&(peStack_20->m_files).m_mtime + 1),
               &(this->super_torrent_hot_members).m_torrent_file);
  }
  *(byte *)((long)&(peStack_20->m_info_section).px + 5) = (byte)this->field_0x5c0 >> 2 & 1;
  (peStack_20->m_files).m_files.
  super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
  super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
  _M_impl.super__Vector_impl_data._M_start = *(pointer *)&this->m_error;
  (peStack_20->m_files).m_files.
  super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
  super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)(this->m_error).cat_;
  *(int *)&(peStack_20->m_files).m_files.
           super_vector<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>.
           super__Vector_base<libtorrent::aux::file_entry,_std::allocator<libtorrent::aux::file_entry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage = (this->m_error_file).m_val;
  *(byte *)((long)&(peStack_20->m_info_section).px + 6) =
       (byte)(*(uint *)&this->field_0x600 >> 5) & 1;
  *(byte *)((long)&(peStack_20->m_info_section).px + 7) = this->field_0x5c0 & 1;
  *(byte *)&(peStack_20->m_info_section).pn.pi_ = (byte)this->field_0x5c0 >> 1 & 1;
  *(byte *)((long)&(peStack_20->m_info_section).pn.pi_ + 1) =
       (byte)((uint)*(undefined4 *)&this->field_0x5dd >> 0x18) & 1;
  (peStack_20->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)this->m_added_time;
  (peStack_20->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this->m_completed_time;
  *(int *)&(peStack_20->m_piece_layers).
           super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           .
           super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = 0;
  *(int *)((long)&(peStack_20->m_piece_layers).
                  super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                  .
                  super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  iVar3 = num_peers(this);
  *(uint *)((long)&(peStack_20->m_collections).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
       iVar3 - (uint)this->m_num_connecting;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
  if (bVar1) {
    ppVar5 = ::std::
             unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
             ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    local_234 = peer_list::num_peers(ppVar5);
  }
  else {
    local_234 = 0;
  }
  *(int *)((long)&(peStack_20->m_owned_collections).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4) = local_234;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
  if (bVar1) {
    ppVar5 = ::std::
             unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
             ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    local_238 = peer_list::num_seeds(ppVar5);
  }
  else {
    local_238 = 0;
  }
  *(int *)&(peStack_20->m_owned_collections).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish = local_238;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
  if (bVar1) {
    ppVar5 = ::std::
             unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
             ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    local_23c = peer_list::num_connect_candidates(ppVar5);
  }
  else {
    local_23c = 0;
  }
  *(int *)&(peStack_20->m_owned_collections).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage = local_23c;
  s = settings(this);
  iVar3 = seed_rank(this,s);
  *(int *)&(peStack_20->m_piece_layers).
           super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           .
           super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage = iVar3;
  (peStack_20->m_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this->m_total_uploaded;
  (peStack_20->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this->m_total_downloaded;
  local_c4.__r = (rep_conflict)finished_time(this);
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_c0,&local_c4);
  (peStack_20->m_info_dict).m_buffer = local_c0;
  local_d4.__r = (rep_conflict)active_time(this);
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_d0,&local_d4);
  (peStack_20->m_info_dict).m_root_tokens = local_d0;
  local_e4.__r = (rep_conflict)seeding_time(this);
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_e0,&local_e4);
  (peStack_20->m_info_dict).m_buffer_size = (undefined4)local_e0;
  (peStack_20->m_info_dict).m_token_idx = local_e0._4_4_;
  ::std::chrono::
  time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
  ::time_point<std::chrono::duration<int,std::ratio<1l,1l>>,void>
            ((time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              *)&local_f0,&this->m_last_upload);
  (peStack_20->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_f0;
  ::std::chrono::
  time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
  ::time_point<std::chrono::duration<int,std::ratio<1l,1l>>,void>
            ((time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              *)&local_f8,&this->m_last_download);
  (peStack_20->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_f8;
  *(uint *)&(peStack_20->m_owned_similar_torrents).
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (uint)((byte)this->field_0x5c0 >> 4 & 3);
  if (((uint)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 & 0xffffff) == 0xffffff) {
    local_240 = 0xffffffff;
  }
  else {
    local_240 = (uint)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 & 0xffffff;
  }
  *(uint *)&(peStack_20->m_owned_collections).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = local_240;
  if ((*(uint *)&this->field_0x5dd & 0xffffff) == 0xffffff) {
    local_244 = 0xffffffff;
  }
  else {
    local_244 = *(uint *)&this->field_0x5dd & 0xffffff;
  }
  *(uint *)((long)&(peStack_20->m_owned_collections).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4) = local_244;
  bVar1 = is_seed(this);
  *(bool *)((long)&(peStack_20->m_info_section).px + 2) = bVar1;
  bVar1 = is_finished(this);
  *(bool *)((long)&(peStack_20->m_info_section).px + 3) = bVar1;
  bVar1 = valid_metadata(this);
  *(bool *)((long)&(peStack_20->m_info_section).px + 4) = bVar1;
  local_fc = flags.m_val;
  bytes_done(this,(torrent_status *)peStack_20,flags);
  iVar6 = stat::total_payload_download(&this->m_stat);
  (peStack_20->m_files).m_size_on_disk = iVar6;
  _Var7._M_head_impl = (file_storage *)stat::total_payload_upload(&this->m_stat);
  (peStack_20->m_orig_files).m_ptr._M_t.
  super___uniq_ptr_impl<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_libtorrent::file_storage_*,_std::default_delete<const_libtorrent::file_storage>_>
  .super__Head_base<0UL,_const_libtorrent::file_storage_*,_false>._M_head_impl = _Var7._M_head_impl;
  iVar6 = stat::total_payload_download(&this->m_stat);
  iVar8 = stat::total_protocol_download(&this->m_stat);
  *(int64_t *)((long)&(peStack_20->m_files).m_name.field_2 + 8) = iVar6 + iVar8;
  iVar6 = stat::total_payload_upload(&this->m_stat);
  iVar8 = stat::total_protocol_upload(&this->m_stat);
  (peStack_20->m_files).m_total_size = iVar6 + iVar8;
  (peStack_20->m_urls).
  super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>.
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this->m_total_failed_bytes;
  (peStack_20->m_urls).
  super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>.
  super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)this->m_total_redundant_bytes;
  iVar3 = stat::download_rate(&this->m_stat);
  *(int *)&(peStack_20->m_collections).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start = iVar3;
  iVar3 = stat::upload_rate(&this->m_stat);
  *(int *)((long)&(peStack_20->m_collections).
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + 4) = iVar3;
  iVar3 = stat::download_payload_rate(&this->m_stat);
  *(int *)&(peStack_20->m_collections).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish = iVar3;
  iVar3 = stat::upload_payload_rate(&this->m_stat);
  *(int *)((long)&(peStack_20->m_collections).
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish + 4) = iVar3;
  bVar1 = is_paused(this);
  local_245 = true;
  if (!bVar1) {
    local_108.__d.__r =
         (duration)
         boost::asio::
         basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
         ::expiry(&this->m_tracker_timer);
    local_245 = ::std::chrono::operator<(&local_108,&local_24);
  }
  if (local_245 == false) {
    local_130.__d.__r =
         (duration)
         boost::asio::
         basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
         ::expiry(&this->m_tracker_timer);
    local_128._M_nxt = (_Hash_node_base *)::std::chrono::operator-(&local_130,&local_24);
    (peStack_20->m_files).m_paths.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_128._M_nxt;
  }
  else {
    local_11c = 0;
    ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_118,&local_11c);
    ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_110,&local_118);
    (peStack_20->m_files).m_paths.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_110;
  }
  rVar9 = ::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                     &(peStack_20->m_files).m_paths.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (rVar9 < 0) {
    local_144 = 0;
    ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_140,&local_144);
    ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_138,&local_140);
    (peStack_20->m_files).m_paths.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_138;
  }
  tracker_list::last_working_url_abi_cxx11_((string *)local_168,&this->m_trackers);
  ::std::__cxx11::string::operator=
            ((string *)
             &(peStack_20->m_files).m_paths.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_168);
  ::std::__cxx11::string::~string((string *)local_168);
  uVar10 = ::std::__cxx11::string::empty();
  if ((uVar10 & 1) != 0) {
    __range3._4_1_ = info_hash_t::has_v1(&this->m_info_hash);
    __range3._5_1_ = info_hash_t::has_v2(&this->m_info_hash);
    container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>::
    container_wrapper((container_wrapper<const_bool,_libtorrent::protocol_version,_std::array<const_bool,_2UL>_>
                       *)((long)&__range3 + 6),(array<const_bool,_2UL> *)((long)&__range3 + 4));
    tracker_list::begin((tracker_list *)&__end3);
    tracker_list::end((tracker_list *)&t);
    while (bVar1 = boost::intrusive::operator!=
                             (&__end3,(list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                                       *)&t), bVar1) {
      local_190 = boost::intrusive::
                  list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                  ::operator*(&__end3);
      if (((byte)local_190->field_0x6e >> 4 & 1) != 0) {
        local_198._M_current =
             (announce_endpoint *)
             ::std::
             vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
             ::begin(&local_190->endpoints);
        local_1a0 = (announce_endpoint *)
                    ::std::
                    vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                    ::end(&local_190->endpoints);
        local_1a2[0] = __range3._6_1_;
        local_1a2[1] = __range3._7_1_;
        bVar1 = ::std::
                any_of<__gnu_cxx::__normal_iterator<libtorrent::aux::announce_endpoint_const*,std::vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>>,libtorrent::aux::torrent::status(libtorrent::torrent_status*,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>)::__0>
                          (local_198,
                           (__normal_iterator<const_libtorrent::aux::announce_endpoint_*,_std::vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>_>
                            )local_1a0,(anon_class_2_1_d2284f93_for__M_pred)__range3._6_2_);
        if (!bVar1) {
          ::std::__cxx11::string::operator=
                    ((string *)
                     &(peStack_20->m_files).m_paths.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_190->url);
          break;
        }
      }
      boost::intrusive::
      list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
      ::operator++(&__end3);
    }
  }
  local_1b0 = 0x10;
  local_1ac = flags.m_val;
  local_1a8 = (uint)libtorrent::flags::operator&
                              (flags.m_val,
                               (bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void>)0x10
                              );
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_1a8);
  if (bVar1) {
    typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
    operator=((typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
               *)&peStack_20->m_web_seeds,&this->m_verified);
  }
  *(uint *)&(peStack_20->m_merkle_tree).
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
       *(uint *)&this->field_0x5d8 & 0xffffff;
  if (*(int3 *)&this->field_0x5d4 == -1) {
    local_25c = 0xffffffff;
  }
  else {
    local_25c = (uint)*(uint3 *)&this->field_0x5d4;
  }
  *(uint *)&(peStack_20->m_piece_layers).
            super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
            .
            super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = local_25c;
  iVar3 = num_peers(this);
  *(int *)((long)&(peStack_20->m_merkle_tree).
                  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                  .
                  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = iVar3;
  if (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21) &
      0xffffff) == 0xffffff) {
    local_260 = 0xffffffff;
  }
  else {
    local_260 = (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21)
                & 0xffffff;
  }
  *(uint *)((long)&(peStack_20->m_piece_layers).
                   super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                   .
                   super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4) = local_260;
  local_1b4 = (int)queue_position(this);
  ((queue_position_t *)
  ((long)&(peStack_20->m_owned_similar_torrents).
          super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))->m_val = local_1b4;
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool
                    ((bitfield_flag *)&this->m_need_save_resume_data);
  *(bool *)&(peStack_20->m_info_section).px = bVar1;
  ((resume_data_flags_t *)((long)&(peStack_20->m_info_section).px + 1))->m_val =
       (this->m_need_save_resume_data).m_val;
  *(state_t *)
   ((long)&(peStack_20->m_piece_layers).
           super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           .
           super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
       (state_t)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) &
       checking_resume_data;
  local_1c0 = (unsigned_long)torrent::flags(this);
  (peStack_20->m_info_dict).m_last_index = (int)local_1c0;
  (peStack_20->m_info_dict).m_last_token = (int)(local_1c0 >> 0x20);
  bVar1 = valid_metadata(this);
  if (bVar1) {
    iVar3 = block_size(this);
    *(int *)((long)&(peStack_20->m_merkle_tree).
                    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar3;
    if (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7) ==
        1) {
      *(uint *)&(peStack_20->m_owned_similar_torrents).
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(uint3 *)&this->field_0x604 & 0xfffff;
      *(float *)((long)&(peStack_20->m_owned_similar_torrents).
                        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) =
           (float)(*(uint3 *)&this->field_0x604 & 0xfffff) / 1e+06;
    }
    else if ((peStack_20->m_nodes).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      *(int *)&(peStack_20->m_owned_similar_torrents).
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage = 1000000;
      *(float *)((long)&(peStack_20->m_owned_similar_torrents).
                        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) = 1.0;
    }
    else {
      *(int *)&(peStack_20->m_owned_similar_torrents).
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (int)(((long)(peStack_20->m_nodes).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start * 1000000) /
                (long)(peStack_20->m_nodes).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
      *(float *)((long)&(peStack_20->m_owned_similar_torrents).
                        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) =
           (float)*(int *)&(peStack_20->m_owned_similar_torrents).
                           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage / 1e+06;
    }
    local_1c4 = (uint)libtorrent::flags::operator&
                                (flags.m_val,
                                 (bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void>)8)
    ;
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_1c4);
    if (bVar1) {
      this_00 = ::std::
                __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&(this->super_torrent_hot_members).m_torrent_file);
      iVar3 = torrent_info::num_pieces(this_00);
      bVar1 = has_picker(this);
      if (bVar1) {
        bitfield::resize((bitfield *)
                         &(peStack_20->m_urls).
                          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          .
                          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar3,false);
        ___end4 = typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                  ::range((typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                           *)&(peStack_20->m_urls).
                              super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                              .
                              super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_1e4 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                    ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                             *)&__end4);
        rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
              ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                     *)&__end4);
        while( true ) {
          i = local_1e4.m_idx.m_val;
          local_1f0 = rhs.m_idx.m_val;
          bVar1 = libtorrent::operator!=(local_1e4,rhs);
          if (!bVar1) break;
          local_1f4.m_val =
               (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                    ::operator*(&local_1e4);
          ppVar11 = ::std::
                    unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                    ::operator->(&(this->super_torrent_hot_members).m_picker);
          local_1f8 = local_1f4.m_val;
          bVar1 = piece_picker::has_piece_passed(ppVar11,local_1f4);
          if (bVar1) {
            local_1fc = local_1f4.m_val;
            typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
            ::set_bit((typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                       *)&(peStack_20->m_urls).
                          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          .
                          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)local_1f4.m_val);
          }
          local_200.m_val =
               (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                    ::operator++(&local_1e4);
        }
      }
      else if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1e & 1) == 0) {
        bitfield::resize((bitfield *)
                         &(peStack_20->m_urls).
                          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          .
                          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar3,false);
      }
      else {
        bitfield::resize((bitfield *)
                         &(peStack_20->m_urls).
                          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          .
                          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar3,true);
      }
    }
    iVar3 = num_passed(this);
    *(int *)((long)&(peStack_20->m_owned_collections).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = iVar3;
    iVar3 = num_seeds(this);
    *(int *)&(peStack_20->m_collections).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage = iVar3;
    local_20c = 1;
    local_208 = flags.m_val;
    local_204 = (uint)libtorrent::flags::operator&
                                (flags.m_val,
                                 (bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void>)1)
    ;
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_204);
    bVar1 = false;
    if (bVar2) {
      ppVar11 = ::std::
                unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ::get(&(this->super_torrent_hot_members).m_picker);
      bVar1 = ppVar11 != (pointer)0x0;
    }
    if (bVar1) {
      ppVar11 = ::std::
                unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ::operator->(&(this->super_torrent_hot_members).m_picker);
      local_214 = piece_picker::distributed_copies(ppVar11);
      ::std::tie<int,int>((int *)local_228,(int *)&peStack_20->m_merkle_tree);
      ::std::tuple<int&,int&>::operator=(local_228,&local_214);
      *(float *)&(peStack_20->m_merkle_tree).
                 super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish =
           (float)*(int *)&(peStack_20->m_merkle_tree).
                           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                           .
                           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
           (float)*(int *)((long)&(peStack_20->m_merkle_tree).
                                  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                                  .
                                  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4) / 1000.0;
    }
    else {
      *(int *)&(peStack_20->m_merkle_tree).
               super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               .
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_start = -1;
      *(int *)((long)&(peStack_20->m_merkle_tree).
                      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 4) = -1;
      *(float *)&(peStack_20->m_merkle_tree).
                 super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish = -1.0;
    }
    (peStack_20->m_owned_similar_torrents).
    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)this->m_swarm_last_seen_complete;
  }
  else {
    *(state_t *)
     ((long)&(peStack_20->m_piece_layers).
             super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = downloading_metadata;
    *(uint *)&(peStack_20->m_owned_similar_torrents).
              super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
         *(uint3 *)&this->field_0x604 & 0xfffff;
    *(float *)((long)&(peStack_20->m_owned_similar_torrents).
                      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 4) =
         (float)(*(uint3 *)&this->field_0x604 & 0xfffff) / 1e+06;
    *(int *)((long)&(peStack_20->m_merkle_tree).
                    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  }
  return;
}

Assistant:

void torrent::status(torrent_status* st, status_flags_t const flags)
	{
		INVARIANT_CHECK;

		time_point32 const now = aux::time_now32();

		st->handle = get_handle();
		st->info_hashes = info_hash();
#if TORRENT_ABI_VERSION < 3
		st->info_hash = info_hash().get_best();
#endif
#if TORRENT_ABI_VERSION == 1
		st->is_loaded = true;
#endif

		if (flags & torrent_handle::query_name)
			st->name = name();

		if (flags & torrent_handle::query_save_path)
			st->save_path = save_path();

		if (flags & torrent_handle::query_torrent_file)
			st->torrent_file = m_torrent_file;

		st->has_incoming = m_has_incoming;
		st->errc = m_error;
		st->error_file = m_error_file;

#if TORRENT_ABI_VERSION == 1
		if (m_error) st->error = m_error.message()
			+ ": " + resolve_filename(m_error_file);
		st->seed_mode = m_seed_mode;
#endif
		st->moving_storage = m_moving_storage;

		st->announcing_to_trackers = m_announce_to_trackers;
		st->announcing_to_lsd = m_announce_to_lsd;
		st->announcing_to_dht = m_announce_to_dht;
#if TORRENT_ABI_VERSION == 1
		st->stop_when_ready = m_stop_when_ready;
#endif

		st->added_time = m_added_time;
		st->completed_time = m_completed_time;

#if TORRENT_ABI_VERSION == 1
		st->last_scrape = static_cast<int>(total_seconds(now - m_last_scrape));
#endif

#if TORRENT_ABI_VERSION == 1
#ifndef TORRENT_DISABLE_SHARE_MODE
		st->share_mode = m_share_mode;
#else
		st->share_mode = false;
#endif
		st->upload_mode = m_upload_mode;
#endif
		st->up_bandwidth_queue = 0;
		st->down_bandwidth_queue = 0;
#if TORRENT_ABI_VERSION == 1
		st->priority = priority();
#endif

		st->num_peers = num_peers() - m_num_connecting;

		st->list_peers = m_peer_list ? m_peer_list->num_peers() : 0;
		st->list_seeds = m_peer_list ? m_peer_list->num_seeds() : 0;
		st->connect_candidates = m_peer_list ? m_peer_list->num_connect_candidates() : 0;
		TORRENT_ASSERT(st->connect_candidates >= 0);
		st->seed_rank = seed_rank(settings());

		st->all_time_upload = m_total_uploaded;
		st->all_time_download = m_total_downloaded;

		// activity time
#if TORRENT_ABI_VERSION == 1
		st->finished_time = int(total_seconds(finished_time()));
		st->active_time = int(total_seconds(active_time()));
		st->seeding_time = int(total_seconds(seeding_time()));

		time_point32 const unset{seconds32(0)};

		st->time_since_upload = m_last_upload == unset ? -1
			: static_cast<int>(total_seconds(now - m_last_upload));
		st->time_since_download = m_last_download == unset ? -1
			: static_cast<int>(total_seconds(now - m_last_download));
#endif

		st->finished_duration = finished_time();
		st->active_duration = active_time();
		st->seeding_duration = seeding_time();

		st->last_upload = m_last_upload;
		st->last_download = m_last_download;

		st->storage_mode = static_cast<storage_mode_t>(m_storage_mode);

		st->num_complete = (m_complete == 0xffffff) ? -1 : m_complete;
		st->num_incomplete = (m_incomplete == 0xffffff) ? -1 : m_incomplete;
#if TORRENT_ABI_VERSION == 1
		st->paused = is_torrent_paused();
		st->auto_managed = m_auto_managed;
		st->sequential_download = m_sequential_download;
#endif
		st->is_seeding = is_seed();
		st->is_finished = is_finished();
#if TORRENT_ABI_VERSION == 1
#ifndef TORRENT_DISABLE_SUPERSEEDING
		st->super_seeding = m_super_seeding;
#endif
#endif
		st->has_metadata = valid_metadata();
		bytes_done(*st, flags);
		TORRENT_ASSERT(st->total_wanted_done >= 0);
		TORRENT_ASSERT(st->total_done >= st->total_wanted_done);

		// payload transfer
		st->total_payload_download = m_stat.total_payload_download();
		st->total_payload_upload = m_stat.total_payload_upload();

		// total transfer
		st->total_download = m_stat.total_payload_download()
			+ m_stat.total_protocol_download();
		st->total_upload = m_stat.total_payload_upload()
			+ m_stat.total_protocol_upload();

		// failed bytes
		st->total_failed_bytes = m_total_failed_bytes;
		st->total_redundant_bytes = m_total_redundant_bytes;

		// transfer rate
		st->download_rate = m_stat.download_rate();
		st->upload_rate = m_stat.upload_rate();
		st->download_payload_rate = m_stat.download_payload_rate();
		st->upload_payload_rate = m_stat.upload_payload_rate();

		if (is_paused() || m_tracker_timer.expiry() < now)
			st->next_announce = seconds(0);
		else
			st->next_announce = m_tracker_timer.expiry() - now;

		if (st->next_announce.count() < 0)
			st->next_announce = seconds(0);

#if TORRENT_ABI_VERSION == 1
		st->announce_interval = seconds(0);
#endif

		st->current_tracker = m_trackers.last_working_url();
		if (st->current_tracker.empty())
		{
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
			aux::array<bool const, num_protocols, protocol_version> const supports_protocol{
			{
				m_info_hash.has_v1(),
				m_info_hash.has_v2()
			}};
#ifdef __clang__
#pragma clang diagnostic pop
#endif

			for (auto const& t : m_trackers)
			{
				if (!t.verified) continue;
				if (std::any_of(t.endpoints.begin(), t.endpoints.end()
					, [supports_protocol](aux::announce_endpoint const& aep) {
						for (protocol_version const ih : all_versions)
						{
							if (supports_protocol[ih] && aep.info_hashes[ih].updating)
								return false;
						}
						return true;
					})) continue;
				st->current_tracker = t.url;
				break;
			}
		}

		if ((flags & torrent_handle::query_verified_pieces))
		{
			st->verified_pieces = m_verified;
		}

		st->num_uploads = m_num_uploads;
		st->uploads_limit = m_max_uploads == (1 << 24) - 1 ? -1 : m_max_uploads;
		st->num_connections = num_peers();
		st->connections_limit = m_max_connections == (1 << 24) - 1 ? -1 : m_max_connections;
		// if we don't have any metadata, stop here

		st->queue_position = queue_position();
#if TORRENT_ABI_VERSION < 4
		st->need_save_resume = bool(m_need_save_resume_data);
#endif
		st->need_save_resume_data = m_need_save_resume_data;
#if TORRENT_ABI_VERSION == 1
		st->ip_filter_applies = m_apply_ip_filter;
#endif

		st->state = static_cast<torrent_status::state_t>(m_state);
		st->flags = this->flags();

#if TORRENT_USE_ASSERTS
		if (st->state == torrent_status::finished
			|| st->state == torrent_status::seeding)
		{
			// it may be tempting to assume that st->is_finished == true here, but
			// this assumption does not always hold. We transition to "finished"
			// when we receive the last block of the last piece, which is before
			// the hash check comes back. "is_finished" is set to true once all the
			// pieces have been hash checked. So, there's a short window where it
			// doesn't hold.
		}
#endif

		if (!valid_metadata())
		{
			st->state = torrent_status::downloading_metadata;
			st->progress_ppm = m_progress_ppm;
#if !TORRENT_NO_FPU
			st->progress = m_progress_ppm / 1000000.f;
#endif
			st->block_size = 0;
			return;
		}

		st->block_size = block_size();

		if (m_state == torrent_status::checking_files)
		{
			st->progress_ppm = m_progress_ppm;
#if !TORRENT_NO_FPU
			st->progress = m_progress_ppm / 1000000.f;
#endif
		}
		else if (st->total_wanted == 0)
		{
			st->progress_ppm = 1000000;
			st->progress = 1.f;
		}
		else
		{
			st->progress_ppm = int(st->total_wanted_done * 1000000
				/ st->total_wanted);
#if !TORRENT_NO_FPU
			st->progress = float(st->progress_ppm) / 1000000.f;
#endif
		}

		if (flags & torrent_handle::query_pieces)
		{
			int const num_pieces = m_torrent_file->num_pieces();
			if (has_picker())
			{
				st->pieces.resize(num_pieces, false);
				for (auto const i : st->pieces.range())
					if (m_picker->has_piece_passed(i)) st->pieces.set_bit(i);
			}
			else if (m_have_all)
			{
				st->pieces.resize(num_pieces, true);
			}
			else
			{
				st->pieces.resize(num_pieces, false);
			}
		}
		st->num_pieces = num_passed();
#if TORRENT_USE_INVARIANT_CHECKS
		{
			// The documentation states that `num_pieces` is the count of number
			// of bits set in `pieces`. Ensure that invariant holds.
			int num_have_pieces = 0;
			if (has_picker())
			{
				for (auto const i : m_torrent_file->piece_range())
					if (m_picker->has_piece_passed(i)) ++num_have_pieces;
			}
			else if (m_have_all)
			{
				num_have_pieces = m_torrent_file->num_pieces();
			}
			TORRENT_ASSERT(num_have_pieces == st->num_pieces);
		}
#endif
		st->num_seeds = num_seeds();
		if ((flags & torrent_handle::query_distributed_copies) && m_picker.get())
		{
			std::tie(st->distributed_full_copies, st->distributed_fraction) =
				m_picker->distributed_copies();
#if TORRENT_NO_FPU
			st->distributed_copies = -1.f;
#else
			st->distributed_copies = float(st->distributed_full_copies)
				+ float(st->distributed_fraction) / 1000;
#endif
		}
		else
		{
			st->distributed_full_copies = -1;
			st->distributed_fraction = -1;
			st->distributed_copies = -1.f;
		}

		st->last_seen_complete = m_swarm_last_seen_complete;
	}